

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

Var Js::JavascriptOperators::GetThisFromModuleRoot(Var thisVar)

{
  HostObjectBase *pHVar1;
  Var pvVar2;
  
  pHVar1 = RootObjectBase::GetHostObject((RootObjectBase *)thisVar);
  if (pHVar1 != (HostObjectBase *)0x0) {
    pvVar2 = (Var)(**(code **)(*(long *)pHVar1 + 0x2b8))(pHVar1);
    return pvVar2;
  }
  return thisVar;
}

Assistant:

Var JavascriptOperators::GetThisFromModuleRoot(Var thisVar)
    {
        RootObjectBase * rootObject = static_cast<RootObjectBase*>(thisVar);
        RecyclableObject* hostObject = rootObject->GetHostObject();

        //
        // if the module root has the host object, use that as "this"
        //
        if (hostObject)
        {
            thisVar = hostObject->GetHostDispatchVar();
        }
        return thisVar;
    }